

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O3

int evalfile(int f,int n)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char local_428 [8];
  char fname [1024];
  FILE *local_20;
  FILE *ffp;
  
  pcVar3 = eread("Load file: ",local_428,0x400,0x18);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 2;
  }
  else {
    iVar2 = 0;
    if ((*pcVar3 != '\0') && (pcVar3 = adjustname(local_428,1), iVar2 = 0, pcVar3 != (char *)0x0)) {
      iVar2 = 0;
      iVar1 = ffropen(&local_20,pcVar3,(buffer *)0x0);
      if (iVar1 != 5) {
        if (iVar1 != 0) {
          return 0;
        }
        iVar2 = load(local_20,pcVar3);
      }
      ffclose(local_20,(buffer *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int
evalfile(int f, int n)
{
	FILE	*ffp;
	char	 fname[NFILEN], *bufp;
	int	 ret;

	if ((bufp = eread("Load file: ", fname, NFILEN,
	    EFNEW | EFCR)) == NULL)
		return (ABORT);
	if (bufp[0] == '\0')
		return (FALSE);
	if ((bufp = adjustname(fname, TRUE)) == NULL)
		return (FALSE);
	ret = ffropen(&ffp, bufp, NULL);
	if (ret == FIODIR)
		(void)ffclose(ffp, NULL);
	if (ret != FIOSUC)
		return (FALSE);
	ret = load(ffp, bufp);
	(void)ffclose(ffp, NULL);
	return (ret);
}